

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O2

int absl::lts_20250127::crc_internal::CRCImpl::FillZeroesTable(uint32_t poly,Uint32By256 *t)

{
  Uint32By256 *pauVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  uint64_t inc_len;
  long lVar5;
  uint32_t m;
  bool bVar6;
  uint32_t v;
  uint32_t local_44;
  Uint32By256 *local_40;
  ulong local_38;
  
  local_44 = 0x40000000;
  iVar3 = 3;
  local_40 = t;
  while( true ) {
    bVar6 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar6) break;
    anon_unknown_0::PolyMultiply(&local_44,local_44,poly);
  }
  uVar2 = 0;
  m = local_44;
  for (lVar5 = 1; pauVar1 = local_40, iVar3 = (int)uVar2, lVar5 != 0; lVar5 = lVar5 << 4) {
    v = m;
    local_38 = uVar2;
    for (lVar4 = 0; (int)lVar4 != 0xf; lVar4 = lVar4 + 1) {
      (*pauVar1)[iVar3 + lVar4] = v;
      anon_unknown_0::PolyMultiply(&v,m,poly);
    }
    uVar2 = (ulong)((int)local_38 + 0xf);
    m = v;
  }
  if (iVar3 < 0x101) {
    return iVar3;
  }
  raw_log_internal::RawLog(kFatal,"crc.cc",0xa0,"Check %s failed: %s","j <= 256","");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/crc/internal/crc.cc"
                ,0xa0,
                "static int absl::crc_internal::CRCImpl::FillZeroesTable(uint32_t, Uint32By256 *)");
}

Assistant:

int CRCImpl::FillZeroesTable(uint32_t poly, Uint32By256* t) {
  uint32_t inc = 1;
  inc <<= 31;

  // Extend by one zero bit. We know degree > 1 so (inc & 1) == 0.
  inc >>= 1;

  // Now extend by 2, 4, and 8 bits, so now `inc` is extended by one zero byte.
  for (int i = 0; i < 3; ++i) {
    PolyMultiply(&inc, inc, poly);
  }

  int j = 0;
  for (uint64_t inc_len = 1; inc_len != 0; inc_len <<= ZEROES_BASE_LG) {
    // Every entry in the table adds an additional inc_len zeroes.
    uint32_t v = inc;
    for (int a = 1; a != ZEROES_BASE; a++) {
      t[0][j] = v;
      PolyMultiply(&v, inc, poly);
      j++;
    }
    inc = v;
  }
  ABSL_RAW_CHECK(j <= 256, "");
  return j;
}